

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseTree.cpp
# Opt level: O2

SynConstantSet * ParseConstantSet(ParseContext *ctx)

{
  Lexeme *begin;
  IntrusiveList<SynConstant> constants;
  bool bVar1;
  int iVar2;
  SynBase *type;
  undefined4 extraout_var;
  SynIdentifier *this;
  Lexeme *pLVar3;
  Lexeme *pLVar4;
  undefined4 extraout_var_01;
  SynBase *value;
  undefined4 extraout_var_02;
  SynConstant *this_00;
  undefined4 extraout_var_04;
  Lexeme *pLVar5;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  SynConstantSet *this_01;
  InplaceStr IVar6;
  IntrusiveList<SynConstant> constantSet;
  undefined4 extraout_var_00;
  undefined4 extraout_var_03;
  undefined4 extraout_var_08;
  
  begin = ctx->currentLexeme;
  if (begin->type == lex_const) {
    ctx->currentLexeme = begin + 1;
    type = ParseType(ctx,(bool *)0x0,false);
    if (type == (SynBase *)0x0) {
      anon_unknown.dwarf_147a9::Report
                (ctx,ctx->currentLexeme,"ERROR: type name expected after const");
      iVar2 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
      type = (SynBase *)CONCAT44(extraout_var,iVar2);
      SynError::SynError((SynError *)type,ctx->currentLexeme,ctx->currentLexeme);
    }
    constantSet.head = (SynConstant *)0x0;
    constantSet.tail = (SynConstant *)0x0;
    pLVar5 = ctx->currentLexeme;
    bVar1 = anon_unknown.dwarf_147a9::CheckAt
                      (ctx,lex_string,"ERROR: constant name expected after type");
    if (bVar1) {
      IVar6 = ParseContext::Consume(ctx);
      iVar2 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
      this = (SynIdentifier *)CONCAT44(extraout_var_00,iVar2);
      pLVar3 = ParseContext::Previous(ctx);
      pLVar4 = ParseContext::Previous(ctx);
      SynIdentifier::SynIdentifier(this,pLVar3,pLVar4,IVar6);
    }
    else {
      pLVar5 = ParseContext::Previous(ctx);
      iVar2 = (*ctx->allocator->_vptr_Allocator[2])();
      this = (SynIdentifier *)CONCAT44(extraout_var_01,iVar2);
      SynIdentifier::SynIdentifier(this,(InplaceStr)ZEXT816(0));
    }
    anon_unknown.dwarf_147a9::CheckConsume(ctx,lex_set,"ERROR: \'=\' not found after constant name")
    ;
    value = ParseTernaryExpr(ctx);
    if (value == (SynBase *)0x0) {
      anon_unknown.dwarf_147a9::Report
                (ctx,ctx->currentLexeme,"ERROR: expression not found after \'=\'");
      iVar2 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
      value = (SynBase *)CONCAT44(extraout_var_02,iVar2);
      SynError::SynError((SynError *)value,ctx->currentLexeme,ctx->currentLexeme);
    }
    iVar2 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
    this_00 = (SynConstant *)CONCAT44(extraout_var_03,iVar2);
    pLVar3 = ParseContext::Previous(ctx);
    while( true ) {
      SynConstant::SynConstant(this_00,pLVar5,pLVar3,this,value);
      IntrusiveList<SynConstant>::push_back(&constantSet,this_00);
      if (ctx->currentLexeme->type != lex_comma) break;
      pLVar5 = ctx->currentLexeme + 1;
      ctx->currentLexeme = pLVar5;
      bVar1 = anon_unknown.dwarf_147a9::CheckAt
                        (ctx,lex_string,"ERROR: constant name expected after \',\'");
      if (bVar1) {
        IVar6 = ParseContext::Consume(ctx);
        iVar2 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
        this = (SynIdentifier *)CONCAT44(extraout_var_04,iVar2);
        pLVar3 = ParseContext::Previous(ctx);
        pLVar4 = ParseContext::Previous(ctx);
        SynIdentifier::SynIdentifier(this,pLVar3,pLVar4,IVar6);
      }
      else {
        pLVar5 = ParseContext::Previous(ctx);
        iVar2 = (*ctx->allocator->_vptr_Allocator[2])();
        this = (SynIdentifier *)CONCAT44(extraout_var_05,iVar2);
        SynIdentifier::SynIdentifier(this,(InplaceStr)ZEXT816(0));
      }
      if (ctx->currentLexeme->type == lex_set) {
        ctx->currentLexeme = ctx->currentLexeme + 1;
        value = ParseTernaryExpr(ctx);
        if (value == (SynBase *)0x0) {
          anon_unknown.dwarf_147a9::Report
                    (ctx,ctx->currentLexeme,"ERROR: expression not found after \'=\'");
          iVar2 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
          value = (SynBase *)CONCAT44(extraout_var_06,iVar2);
          SynError::SynError((SynError *)value,ctx->currentLexeme,ctx->currentLexeme);
        }
      }
      else {
        value = (SynBase *)0x0;
      }
      iVar2 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
      this_00 = (SynConstant *)CONCAT44(extraout_var_07,iVar2);
      pLVar3 = ParseContext::Previous(ctx);
    }
    anon_unknown.dwarf_147a9::CheckConsume
              (ctx,lex_semicolon,"ERROR: \';\' not found after constants");
    iVar2 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x58);
    this_01 = (SynConstantSet *)CONCAT44(extraout_var_08,iVar2);
    pLVar5 = ParseContext::Previous(ctx);
    constants.tail = constantSet.tail;
    constants.head = constantSet.head;
    SynConstantSet::SynConstantSet(this_01,begin,pLVar5,type,constants);
  }
  else {
    this_01 = (SynConstantSet *)0x0;
  }
  return this_01;
}

Assistant:

SynConstantSet* ParseConstantSet(ParseContext &ctx)
{
	Lexeme *start = ctx.currentLexeme;

	if(ctx.Consume(lex_const))
	{
		SynBase *type = ParseType(ctx);

		if(!type)
		{
			Report(ctx, ctx.Current(), "ERROR: type name expected after const");

			type = new (ctx.get<SynError>()) SynError(ctx.Current(), ctx.Current());
		}

		IntrusiveList<SynConstant> constantSet;

		Lexeme *pos = ctx.currentLexeme;

		SynIdentifier *nameIdentifier = NULL;

		if(CheckAt(ctx, lex_string, "ERROR: constant name expected after type"))
		{
			InplaceStr name = ctx.Consume();
			nameIdentifier = new (ctx.get<SynIdentifier>()) SynIdentifier(ctx.Previous(), ctx.Previous(), name);
		}
		else
		{
			pos = ctx.Previous();

			nameIdentifier = new (ctx.get<SynIdentifier>()) SynIdentifier(InplaceStr());
		}

		CheckConsume(ctx, lex_set, "ERROR: '=' not found after constant name");

		SynBase *value = ParseTernaryExpr(ctx);

		if(!value)
		{
			Report(ctx, ctx.Current(), "ERROR: expression not found after '='");

			value = new (ctx.get<SynError>()) SynError(ctx.Current(), ctx.Current());
		}

		constantSet.push_back(new (ctx.get<SynConstant>()) SynConstant(pos, ctx.Previous(), nameIdentifier, value));

		while(ctx.Consume(lex_comma))
		{
			pos = ctx.currentLexeme;

			if(CheckAt(ctx, lex_string, "ERROR: constant name expected after ','"))
			{
				InplaceStr name = ctx.Consume();
				nameIdentifier = new (ctx.get<SynIdentifier>()) SynIdentifier(ctx.Previous(), ctx.Previous(), name);
			}
			else
			{
				pos = ctx.Previous();

				nameIdentifier = new (ctx.get<SynIdentifier>()) SynIdentifier(InplaceStr());
			}

			value = NULL;

			if(ctx.Consume(lex_set))
			{
				value = ParseTernaryExpr(ctx);

				if(!value)
				{
					Report(ctx, ctx.Current(), "ERROR: expression not found after '='");

					value = new (ctx.get<SynError>()) SynError(ctx.Current(), ctx.Current());
				}
			}

			constantSet.push_back(new (ctx.get<SynConstant>()) SynConstant(pos, ctx.Previous(), nameIdentifier, value));
		}

		CheckConsume(ctx, lex_semicolon, "ERROR: ';' not found after constants");

		return new (ctx.get<SynConstantSet>()) SynConstantSet(start, ctx.Previous(), type, constantSet);
	}

	return NULL;
}